

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_analyze.hpp
# Opt level: O2

bool duckdb::AlpRDAnalyze<double>(AnalyzeState *state,Vector *input,idx_t count)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  value_type vVar3;
  reference pvVar4;
  reference pvVar5;
  ulong uVar6;
  unsigned_long *value;
  size_type sVar7;
  value_type_conflict *__x;
  idx_t i;
  ulong uVar8;
  idx_t i_1;
  size_type nulls_count;
  ulong uVar9;
  AlpSamplingParameters AVar10;
  allocator_type local_d1;
  data_ptr_t local_d0;
  ulong local_c8;
  vector<unsigned_long,_true> current_vector_sample;
  value_type_conflict local_98;
  vector<unsigned_short,_true> current_vector_null_positions;
  UnifiedVectorFormat vdata;
  
  pp_Var1 = state[1]._vptr_AnalyzeState;
  if ((ulong)pp_Var1 % 7 == 0) {
    pp_Var2 = state[2]._vptr_AnalyzeState;
    state[1].info.block_manager =
         (BlockManager *)((long)&(state[1].info.block_manager)->_vptr_BlockManager + count);
    state[1]._vptr_AnalyzeState = (_func_int **)((long)pp_Var1 + 1);
    if ((0x1f < count) || (pp_Var2 == (_func_int **)0x0)) {
      UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
      Vector::ToUnifiedFormat(input,count,&vdata);
      local_d0 = vdata.data;
      AVar10 = alp::AlpUtils::GetSamplingParameters(count);
      local_c8 = AVar10._0_8_ & 0xffffffff;
      current_vector_sample.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_2_ = 0;
      ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                (&current_vector_null_positions.
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>,local_c8,
                 (value_type_conflict8 *)&current_vector_sample,(allocator_type *)&local_98);
      local_98 = 0;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&current_vector_sample.super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                 (ulong)AVar10.n_sampled_values,&local_98,&local_d1);
      uVar9 = AVar10._0_8_ >> 0x20;
      if (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        sVar7 = 0;
        for (uVar8 = 0; uVar8 < local_c8; uVar8 = uVar8 + uVar9) {
          uVar6 = uVar8;
          if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar6 = (ulong)(vdata.sel)->sel_vector[uVar8];
          }
          vVar3 = *(value_type *)(local_d0 + uVar6 * 8);
          pvVar4 = vector<unsigned_long,_true>::get<true>(&current_vector_sample,sVar7);
          *pvVar4 = vVar3;
          sVar7 = sVar7 + 1;
        }
      }
      else {
        nulls_count = 0;
        sVar7 = 0;
        for (uVar8 = 0; uVar8 < local_c8; uVar8 = uVar8 + uVar9) {
          uVar6 = uVar8;
          if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar6 = (ulong)(vdata.sel)->sel_vector[uVar8];
          }
          vVar3 = *(value_type *)(local_d0 + uVar6 * 8);
          pvVar4 = vector<unsigned_long,_true>::get<true>(&current_vector_sample,sVar7);
          *pvVar4 = vVar3;
          if (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            uVar6 = 0;
          }
          else {
            uVar6 = (ulong)((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                             [uVar6 >> 6] >> (uVar6 & 0x3f) & 1) == 0);
          }
          pvVar5 = vector<unsigned_short,_true>::get<true>
                             (&current_vector_null_positions,nulls_count);
          *pvVar5 = (value_type)sVar7;
          nulls_count = nulls_count + uVar6;
          sVar7 = sVar7 + 1;
        }
        alp::AlpUtils::FindAndReplaceNullsInVector<unsigned_long>
                  ((unsigned_long *)
                   CONCAT62(current_vector_sample.
                            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start._2_6_,
                            current_vector_sample.
                            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start._0_2_),
                   current_vector_null_positions.
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start,(ulong)AVar10.n_sampled_values,nulls_count);
      }
      for (__x = (value_type_conflict *)
                 CONCAT62(current_vector_sample.
                          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start._2_6_,
                          current_vector_sample.
                          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start._0_2_);
          __x != current_vector_sample.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish; __x = __x + 1) {
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&state[2].info,__x);
      }
      state[2]._vptr_AnalyzeState = (_func_int **)((long)state[2]._vptr_AnalyzeState + 1);
      ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &current_vector_sample);
      ::std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)
                 &current_vector_null_positions);
      UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
    }
  }
  else {
    state[1]._vptr_AnalyzeState = (_func_int **)((long)pp_Var1 + 1);
    state[1].info.block_manager =
         (BlockManager *)((long)&(state[1].info.block_manager)->_vptr_BlockManager + count);
  }
  return true;
}

Assistant:

bool AlpRDAnalyze(AnalyzeState &state, Vector &input, idx_t count) {
	using EXACT_TYPE = typename FloatingToExact<T>::TYPE;
	auto &analyze_state = (AlpRDAnalyzeState<T> &)state;

	bool must_skip_current_vector = alp::AlpUtils::MustSkipSamplingFromCurrentVector(
	    analyze_state.vectors_count, analyze_state.vectors_sampled_count, count);
	analyze_state.vectors_count += 1;
	analyze_state.total_values_count += count;
	if (must_skip_current_vector) {
		return true;
	}

	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);
	auto data = UnifiedVectorFormat::GetData<T>(vdata);

	alp::AlpSamplingParameters sampling_params = alp::AlpUtils::GetSamplingParameters(count);

	vector<uint16_t> current_vector_null_positions(sampling_params.n_lookup_values, 0);
	vector<EXACT_TYPE> current_vector_sample(sampling_params.n_sampled_values, 0);

	// Storing the sample of that vector
	idx_t sample_idx = 0;
	idx_t nulls_idx = 0;
	// We optimize by doing a different loop when there are no nulls
	if (vdata.validity.AllValid()) {
		for (idx_t i = 0; i < sampling_params.n_lookup_values; i += sampling_params.n_sampled_increments) {
			auto idx = vdata.sel->get_index(i);
			EXACT_TYPE value = Load<EXACT_TYPE>(const_data_ptr_cast(&data[idx]));
			current_vector_sample[sample_idx] = value;
			sample_idx++;
		}
	} else {
		for (idx_t i = 0; i < sampling_params.n_lookup_values; i += sampling_params.n_sampled_increments) {
			auto idx = vdata.sel->get_index(i);
			EXACT_TYPE value = Load<EXACT_TYPE>(const_data_ptr_cast(&data[idx]));
			current_vector_sample[sample_idx] = value;
			//! We resolve null values with a predicated comparison
			bool is_null = !vdata.validity.RowIsValid(idx);
			current_vector_null_positions[nulls_idx] = UnsafeNumericCast<uint16_t>(sample_idx);
			nulls_idx += is_null;
			sample_idx++;
		}
		alp::AlpUtils::FindAndReplaceNullsInVector<EXACT_TYPE>(current_vector_sample.data(),
		                                                       current_vector_null_positions.data(),
		                                                       sampling_params.n_sampled_values, nulls_idx);
	}

	D_ASSERT(sample_idx == sampling_params.n_sampled_values);

	// Pushing the sampled vector samples into the rowgroup samples
	for (auto &value : current_vector_sample) {
		analyze_state.rowgroup_sample.push_back(value);
	}

	analyze_state.vectors_sampled_count++;
	return true;
}